

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O3

bool __thiscall
duckdb::CatalogSet::CreateEntryInternal
          (CatalogSet *this,CatalogTransaction transaction,string *name,
          unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *value,
          unique_lock<std::mutex> *read_lock,bool should_be_empty)

{
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> _Var1;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  optional_ptr<duckdb::Transaction,_true> transaction_p;
  bool bVar2;
  iterator iVar3;
  DuckTransactionManager *this_00;
  type entry;
  CatalogSet *this_01;
  optional_ptr<duckdb::CatalogEntry,_true> entry_value;
  __uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_> local_70;
  CatalogEntry *local_68;
  __native_type local_60;
  transaction_t local_38;
  
  local_60.__align = (long)value;
  iVar3 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
                  *)&this->map,name);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->map).entries._M_t._M_impl.super__Rb_tree_header) {
    local_68 = (CatalogEntry *)0x0;
LAB_011fb42a:
    transaction_01.context.ptr = transaction.context.ptr;
    transaction_01.db.ptr = transaction.db.ptr;
    transaction_01.transaction.ptr = transaction.transaction.ptr;
    transaction_01.transaction_id = transaction.transaction_id;
    transaction_01.start_time = transaction.start_time;
    bVar2 = StartChain(this,transaction_01,name,read_lock);
  }
  else {
    local_68 = *(CatalogEntry **)(iVar3._M_node + 2);
    if (local_68 == (CatalogEntry *)0x0) goto LAB_011fb42a;
    if (!should_be_empty) goto LAB_011fb459;
    local_38 = transaction.start_time;
    local_60.__data.__list.__prev = (__pthread_internal_list *)transaction.transaction.ptr;
    local_60.__data.__list.__next = (__pthread_internal_list *)transaction.transaction_id;
    local_60._8_8_ = transaction.db.ptr;
    local_60._16_8_ = transaction.context.ptr;
    this_01 = (CatalogSet *)&local_68;
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
              ((optional_ptr<duckdb::CatalogEntry,_true> *)this_01);
    transaction_00.context.ptr = (ClientContext *)local_60._16_8_;
    transaction_00.db.ptr = (DatabaseInstance *)local_60._8_8_;
    transaction_00.transaction.ptr = (Transaction *)local_60.__data.__list.__prev;
    transaction_00.transaction_id = (transaction_t)local_60.__data.__list.__next;
    transaction_00.start_time = local_38;
    bVar2 = VerifyVacancy(this_01,transaction_00,local_68);
  }
  if (bVar2 == false) {
    return false;
  }
LAB_011fb459:
  _Var1._M_head_impl = *(CatalogEntry **)local_60.__align;
  *(CatalogEntry **)local_60.__align = (CatalogEntry *)0x0;
  local_70._M_t.
  super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
  super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
       (tuple<duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)
       (tuple<duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)_Var1._M_head_impl
  ;
  CatalogEntryMap::UpdateEntry
            (&this->map,
             (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
             &local_70);
  if ((_Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)
      local_70._M_t.
      super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
      super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl != (CatalogEntry *)0x0) {
    (**(code **)(*(long *)local_70._M_t.
                          super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
                          .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl + 8))()
    ;
  }
  local_70._M_t.
  super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
  super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
       (tuple<duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)
       (_Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)0x0;
  if (transaction.transaction.ptr != (Transaction *)0x0) {
    this_00 = DuckTransactionManager::Get((this->catalog->super_Catalog).db);
    optional_ptr<duckdb::Transaction,_true>::CheckValid(&transaction.transaction);
    transaction_p = transaction.transaction;
    entry = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
            operator*(&(_Var1._M_head_impl)->child);
    DuckTransactionManager::PushCatalogEntry(this_00,transaction_p.ptr,entry,(data_ptr_t)0x0,0);
  }
  return true;
}

Assistant:

bool CatalogSet::CreateEntryInternal(CatalogTransaction transaction, const string &name, unique_ptr<CatalogEntry> value,
                                     unique_lock<mutex> &read_lock, bool should_be_empty) {
	auto entry_value = map.GetEntry(name);
	if (!entry_value) {
		// Add a dummy node to start the chain
		if (!StartChain(transaction, name, read_lock)) {
			return false;
		}
	} else if (should_be_empty) {
		// Verify that the entry is deleted, not altered by another transaction
		if (!VerifyVacancy(transaction, *entry_value)) {
			return false;
		}
	}

	// Finally add the new entry to the chain
	auto value_ptr = value.get();
	map.UpdateEntry(std::move(value));
	// Push the old entry in the undo buffer for this transaction, so it can be restored in the event of failure
	if (transaction.transaction) {
		DuckTransactionManager::Get(GetCatalog().GetAttached())
		    .PushCatalogEntry(*transaction.transaction, value_ptr->Child());
	}
	return true;
}